

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathCompareValues(xmlXPathParserContextPtr ctxt,int inf,int strict)

{
  double dVar1;
  double dVar2;
  int iVar3;
  xmlXPathObjectType xVar4;
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr value;
  double dVar5;
  bool bVar6;
  xmlXPathObjectType xVar7;
  uint uVar8;
  xmlXPathObjectPtr arg;
  double dVar9;
  uint uVar10;
  xmlXPathContextPtr ctxt_00;
  uint uVar11;
  bool bVar12;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return 0;
  }
  if (ctxt->context == (xmlXPathContextPtr)0x0) {
    return 0;
  }
  obj = valuePop(ctxt);
  value = valuePop(ctxt);
  if (obj == (xmlXPathObjectPtr)0x0 || value == (xmlXPathObjectPtr)0x0) {
    ctxt_00 = ctxt->context;
    if (value == (xmlXPathObjectPtr)0x0) {
LAB_001d9e1a:
      value = obj;
    }
    xmlXPathReleaseObject(ctxt_00,value);
LAB_001d9e22:
    xmlXPathErr(ctxt,10);
    return 0;
  }
  xVar4 = obj->type;
  if ((xVar4 | XPATH_USERS) != XPATH_XSLT_TREE) {
    xVar7 = value->type;
    if (xVar7 != XPATH_XSLT_TREE) {
      if (xVar7 != XPATH_NUMBER) {
        if (xVar7 == XPATH_NODESET) goto LAB_001d9c03;
        valuePush(ctxt,value);
        xmlXPathNumberFunction(ctxt,1);
        value = valuePop(ctxt);
        if (value->type != XPATH_NUMBER) {
          xmlXPathFreeObject(value);
          xmlXPathFreeObject(obj);
          goto LAB_001d9e22;
        }
        xVar4 = obj->type;
      }
      if (xVar4 != XPATH_NUMBER) {
        valuePush(ctxt,obj);
        xmlXPathNumberFunction(ctxt,1);
        obj = valuePop(ctxt);
        if (obj->type != XPATH_NUMBER) {
          xmlXPathReleaseObject(ctxt->context,value);
          ctxt_00 = ctxt->context;
          goto LAB_001d9e1a;
        }
      }
      dVar1 = value->floatval;
      if (NAN(dVar1)) {
LAB_001d9e7d:
        uVar8 = 0;
        goto LAB_001d9e7f;
      }
      dVar2 = obj->floatval;
      uVar8 = 0;
      if (NAN(dVar2)) goto LAB_001d9e7f;
      dVar5 = ABS(dVar1);
      uVar11 = ((0.0 < dVar1) - 1) + (uint)(0.0 < dVar1);
      if (dVar5 != INFINITY) {
        uVar11 = uVar8;
      }
      dVar9 = ABS(dVar2);
      uVar10 = ((0.0 < dVar2) - 1) + (uint)(0.0 < dVar2);
      if (dVar9 != INFINITY) {
        uVar10 = uVar8;
      }
      if (strict == 0 || inf == 0) {
        if (inf == 0 || strict != 0) {
          if (strict == 0 || inf != 0) {
            if (strict != 0 || inf != 0) goto LAB_001d9e7d;
            uVar8 = 1;
            if ((0.0 < dVar1 && dVar5 == INFINITY) || (uVar10 == 0xffffffff)) goto LAB_001d9e7f;
            bVar12 = dVar1 < dVar2;
            goto LAB_001d9e6e;
          }
          uVar8 = 1;
          if ((((0.0 < dVar1) && (uVar10 != 1)) && (dVar5 == INFINITY)) ||
             ((0.0 < dVar1 || dVar5 != INFINITY && (uVar10 == 0xffffffff)))) goto LAB_001d9e7f;
          bVar12 = dVar2 < dVar1;
        }
        else {
          uVar8 = 1;
          if ((uVar11 == 0xffffffff) || (0.0 < dVar2 && dVar9 == INFINITY)) goto LAB_001d9e7f;
          bVar12 = dVar2 < dVar1;
LAB_001d9e6e:
          bVar12 = !bVar12;
        }
        bVar6 = dVar5 != INFINITY && dVar9 != INFINITY;
      }
      else {
        uVar8 = 1;
        if (((uVar11 == 0xffffffff) && (0.0 < dVar2 || dVar9 != INFINITY)) ||
           ((uVar11 != 1 && 0.0 < dVar2) && dVar9 == INFINITY)) goto LAB_001d9e7f;
        bVar12 = dVar5 != INFINITY;
        bVar6 = dVar1 < dVar2 && dVar9 != INFINITY;
      }
      uVar8 = (uint)(byte)(bVar6 & bVar12);
LAB_001d9e7f:
      xmlXPathReleaseObject(ctxt->context,value);
      xmlXPathReleaseObject(ctxt->context,obj);
      return uVar8;
    }
LAB_001d9c03:
    if (xVar4 != XPATH_NODESET) goto LAB_001d9c08;
  }
  xVar7 = value->type;
  if ((xVar7 | XPATH_USERS) == XPATH_XSLT_TREE) {
    iVar3 = xmlXPathCompareNodeSets(inf,strict,value,obj);
    return iVar3;
  }
LAB_001d9c08:
  arg = value;
  if ((xVar7 | XPATH_USERS) != XPATH_XSLT_TREE) {
    inf = (int)(inf == 0);
    arg = obj;
    obj = value;
  }
  iVar3 = xmlXPathCompareNodeSetValue(ctxt,inf,strict,arg,obj);
  return iVar3;
}

Assistant:

int
xmlXPathCompareValues(xmlXPathParserContextPtr ctxt, int inf, int strict) {
    int ret = 0, arg1i = 0, arg2i = 0;
    xmlXPathObjectPtr arg1, arg2;

    if ((ctxt == NULL) || (ctxt->context == NULL)) return(0);
    arg2 = valuePop(ctxt);
    arg1 = valuePop(ctxt);
    if ((arg1 == NULL) || (arg2 == NULL)) {
	if (arg1 != NULL)
	    xmlXPathReleaseObject(ctxt->context, arg1);
	else
	    xmlXPathReleaseObject(ctxt->context, arg2);
	XP_ERROR0(XPATH_INVALID_OPERAND);
    }

    if ((arg2->type == XPATH_NODESET) || (arg2->type == XPATH_XSLT_TREE) ||
      (arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE)) {
	/*
	 * If either argument is a XPATH_NODESET or XPATH_XSLT_TREE the two arguments
	 * are not freed from within this routine; they will be freed from the
	 * called routine, e.g. xmlXPathCompareNodeSets or xmlXPathCompareNodeSetValue
	 */
	if (((arg2->type == XPATH_NODESET) || (arg2->type == XPATH_XSLT_TREE)) &&
	  ((arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE))){
	    ret = xmlXPathCompareNodeSets(inf, strict, arg1, arg2);
	} else {
	    if ((arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE)) {
		ret = xmlXPathCompareNodeSetValue(ctxt, inf, strict,
			                          arg1, arg2);
	    } else {
		ret = xmlXPathCompareNodeSetValue(ctxt, !inf, strict,
			                          arg2, arg1);
	    }
	}
	return(ret);
    }

    if (arg1->type != XPATH_NUMBER) {
	valuePush(ctxt, arg1);
	xmlXPathNumberFunction(ctxt, 1);
	arg1 = valuePop(ctxt);
    }
    if (arg1->type != XPATH_NUMBER) {
	xmlXPathFreeObject(arg1);
	xmlXPathFreeObject(arg2);
	XP_ERROR0(XPATH_INVALID_OPERAND);
    }
    if (arg2->type != XPATH_NUMBER) {
	valuePush(ctxt, arg2);
	xmlXPathNumberFunction(ctxt, 1);
	arg2 = valuePop(ctxt);
    }
    if (arg2->type != XPATH_NUMBER) {
	xmlXPathReleaseObject(ctxt->context, arg1);
	xmlXPathReleaseObject(ctxt->context, arg2);
	XP_ERROR0(XPATH_INVALID_OPERAND);
    }
    /*
     * Add tests for infinity and nan
     * => feedback on 3.4 for Inf and NaN
     */
    /* Hand check NaN and Infinity comparisons */
    if (xmlXPathIsNaN(arg1->floatval) || xmlXPathIsNaN(arg2->floatval)) {
	ret=0;
    } else {
	arg1i=xmlXPathIsInf(arg1->floatval);
	arg2i=xmlXPathIsInf(arg2->floatval);
	if (inf && strict) {
	    if ((arg1i == -1 && arg2i != -1) ||
		(arg2i == 1 && arg1i != 1)) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval < arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
	else if (inf && !strict) {
	    if (arg1i == -1 || arg2i == 1) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval <= arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
	else if (!inf && strict) {
	    if ((arg1i == 1 && arg2i != 1) ||
		(arg2i == -1 && arg1i != -1)) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval > arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
	else if (!inf && !strict) {
	    if (arg1i == 1 || arg2i == -1) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval >= arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
    }
    xmlXPathReleaseObject(ctxt->context, arg1);
    xmlXPathReleaseObject(ctxt->context, arg2);
    return(ret);
}